

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepImageLevel.cpp
# Opt level: O2

void __thiscall Imf_2_5::DeepImageLevel::resize(DeepImageLevel *this,Box2i *dataWindow)

{
  _Base_ptr p_Var1;
  
  ImageLevel::resize(&this->super_ImageLevel,dataWindow);
  SampleCountChannel::resize(&this->_sampleCounts);
  for (p_Var1 = (this->_channels)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->_channels)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    (**(code **)(**(long **)(p_Var1 + 2) + 0x18))();
  }
  return;
}

Assistant:

void			
DeepImageLevel::resize (const Box2i& dataWindow)
{
    //
    // Note: if the following code throws an exception, then the image level
    // may be left in an inconsistent state where some channels have been
    // resized, but others have not.  However, the image to which this level
    // belongs will catch the exception and clean up the mess.
    //

    ImageLevel::resize (dataWindow);
    _sampleCounts.resize();

    for (ChannelMap::iterator i = _channels.begin(); i != _channels.end(); ++i)
        i->second->resize();
}